

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_pass.cc
# Opt level: O2

ssize_t sock_fd_read(int sock,void *buf,ssize_t bufsize,int *fd)

{
  ssize_t sVar1;
  char *__s;
  iovec iov;
  msghdr msg;
  anon_union_56_2_2032e646 cmsgu;
  
  if (fd == (int *)0x0) {
    sVar1 = read(sock,buf,bufsize);
    if (-1 < sVar1) {
      return sVar1;
    }
    __s = "read";
  }
  else {
    msg.msg_iov = &iov;
    msg.msg_name = (void *)0x0;
    msg.msg_namelen = 0;
    msg.msg_iovlen = 1;
    msg.msg_control = &cmsgu;
    msg.msg_controllen = 0x18;
    iov.iov_base = buf;
    iov.iov_len = bufsize;
    sVar1 = recvmsg(sock,(msghdr *)&msg,0);
    if (-1 < sVar1) {
      if ((msg.msg_control == (void *)0x0 || msg.msg_controllen < 0x10) ||
         (*msg.msg_control != 0x14)) {
        *fd = -1;
        return sVar1;
      }
      if (*(int *)((long)msg.msg_control + 8) == 1) {
        *fd = *(int *)((long)msg.msg_control + 0x10);
        printf("received fd %d\n");
        return sVar1;
      }
      fprintf(_stderr,"invalid cmsg_level %d\n");
      goto LAB_001071e3;
    }
    __s = "recvmsg";
  }
  perror(__s);
LAB_001071e3:
  exit(1);
}

Assistant:

ssize_t
sock_fd_read(int sock, void *buf, ssize_t bufsize, int *fd)
{
    ssize_t size;

    if(fd){
        struct msghdr msg;
        struct iovec iov;
        union{
            struct msghdr cmsghdr;
            char control[CMSG_SPACE(sizeof (int))];
        } cmsgu;
        struct cmsghdr *cmsg;

        iov.iov_base = buf;
        iov.iov_len = bufsize;

        msg.msg_name = NULL;
        msg.msg_namelen = 0;
        msg.msg_iov = &iov;
        msg.msg_iovlen = 1;
        msg.msg_control = cmsgu.control;
        msg.msg_controllen = sizeof(cmsgu.control);

        size = recvmsg(sock, &msg, 0);
        if(size < 0){
            perror ("recvmsg");
            exit(1);
        }
        cmsg = CMSG_FIRSTHDR(&msg);

        if(cmsg && cmsg->cmsg_len == CMSG_LEN(sizeof (int))){
            if(cmsg->cmsg_level !=SOL_SOCKET){
                fprintf(stderr, "invalid cmsg_level %d\n",
                        cmsg->cmsg_level);
                exit(1);
            }

            *fd = *((int *) CMSG_DATA(cmsg));
            printf ("received fd %d\n", *fd);
        } else {
            *fd = -1;
        }
    } else {
        size = read(sock, buf, bufsize);
        if(size < 0){
            perror("read");
            exit(1);
        }
    }
    return size;
}